

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animation.h
# Opt level: O1

void __thiscall rengine::AnimationManager::~AnimationManager(AnimationManager *this)

{
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  *pvVar1;
  pointer ppBVar2;
  
  (this->super_SignalEmitter)._vptr_SignalEmitter = (_func_int **)&PTR__AnimationManager_001484b8;
  std::__cxx11::
  _List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
  ::_M_clear(&(this->m_scheduledAnimations).
              super__List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
            );
  std::__cxx11::
  _List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
  ::_M_clear(&(this->m_runningAnimations).
              super__List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
            );
  (this->super_SignalEmitter)._vptr_SignalEmitter = (_func_int **)&PTR__SignalEmitter_00147f38;
  Signal<>::emit(&SignalEmitter::onDestruction,&this->super_SignalEmitter);
  pvVar1 = (this->super_SignalEmitter).m_buckets;
  if (pvVar1 != (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                 *)0x0) {
    ppBVar2 = (pvVar1->
              super__Vector_base<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (ppBVar2 != (pointer)0x0) {
      operator_delete(ppBVar2);
    }
    operator_delete(pvVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

AnimationManager()
    {
    }